

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O1

google_protobuf_EnumValueDescriptorProto *
enumvaldef_toproto(upb_ToProto_Context *ctx,upb_EnumValueDef *e)

{
  upb_Arena *puVar1;
  _Bool _Var2;
  int32_t iVar3;
  upb_DecodeStatus uVar4;
  char *__s;
  size_t sVar5;
  google_protobuf_EnumValueOptions *msg;
  google_protobuf_EnumValueDescriptorProto *__s_00;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_00;
  upb_StringView uVar6;
  size_t size;
  char *ptr;
  size_t local_40;
  char *local_38;
  
  puVar1 = ctx->arena;
  __s_00 = (google_protobuf_EnumValueDescriptorProto *)
           puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)__s_00) < 0x28) {
    __s_00 = (google_protobuf_EnumValueDescriptorProto *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x28);
  }
  else {
    if ((google_protobuf_EnumValueDescriptorProto *)
        ((ulong)((long)&(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != __s_00) goto LAB_00118edd;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(__s_00 + 5);
  }
  if (__s_00 == (google_protobuf_EnumValueDescriptorProto *)0x0) {
    __s_00 = (google_protobuf_EnumValueDescriptorProto *)0x0;
  }
  else {
    memset(__s_00,0,0x28);
  }
  if (__s_00 == (google_protobuf_EnumValueDescriptorProto *)0x0) goto LAB_00118ecc;
  __s = upb_EnumValueDef_Name(e);
  sVar5 = strlen(__s);
  uVar6.size = sVar5;
  uVar6.data = __s;
  uVar6 = strviewdup2(ctx,uVar6);
  if (((ulong)(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
    *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
    *(upb_StringView *)(__s_00 + 2) = uVar6;
    iVar3 = upb_EnumValueDef_Number(e);
    if (((ulong)(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
      *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
           *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
      *(int32_t *)((long)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = iVar3;
      _Var2 = upb_EnumValueDef_HasOptions(e);
      if (!_Var2) {
        return __s_00;
      }
      msg = upb_EnumValueDef_Options(e);
      upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
                 &google__protobuf__EnumValueOptions_msg_init,0,ctx->arena,&local_38,&local_40);
      if (local_38 != (char *)0x0) {
        puVar1 = ctx->arena;
        msg_00.internal_opaque = (uintptr_t)puVar1->ptr_dont_copy_me__upb_internal_use_only;
        if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x28) {
          msg_00 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                   _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x28);
        }
        else {
          if ((char *)((ulong)(msg_00.internal_opaque + 7) & 0xfffffffffffffff8) !=
              (char *)msg_00.internal_opaque) {
LAB_00118edd:
            __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                          ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
          }
          puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00.internal_opaque + 0x28);
        }
        if ((char *)msg_00.internal_opaque == (char *)0x0) {
          msg_00.internal_opaque = 0;
        }
        else {
          memset((void *)msg_00,0,0x28);
        }
        if (msg_00.internal_opaque == 0) {
          msg_00.internal_opaque = 0;
        }
        else {
          uVar4 = upb_Decode(local_38,local_40,(upb_Message *)msg_00,
                             &google__protobuf__EnumValueOptions_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,puVar1);
          if (uVar4 != kUpb_DecodeStatus_Ok) {
            msg_00.internal_opaque = 0;
          }
        }
        if ((anon_union_8_2_9eb4e620_for_upb_Message_0)msg_00.internal_opaque !=
            (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
          if (((ulong)(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
            *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
                 *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 4;
            *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(__s_00 + 4) = msg_00;
            return __s_00;
          }
          goto LAB_00118ead;
        }
      }
LAB_00118ecc:
      longjmp((__jmp_buf_tag *)ctx->err,1);
    }
  }
LAB_00118ead:
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                ,0x13b,
                "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
               );
}

Assistant:

static google_protobuf_EnumValueDescriptorProto* enumvaldef_toproto(
    upb_ToProto_Context* ctx, const upb_EnumValueDef* e) {
  google_protobuf_EnumValueDescriptorProto* proto =
      google_protobuf_EnumValueDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_EnumValueDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_EnumValueDef_Name(e)));
  google_protobuf_EnumValueDescriptorProto_set_number(proto, upb_EnumValueDef_Number(e));

  if (upb_EnumValueDef_HasOptions(e)) {
    SET_OPTIONS(proto, EnumValueDescriptorProto, EnumValueOptions,
                upb_EnumValueDef_Options(e));
  }

  return proto;
}